

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O3

void __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
~PriorityQueue(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this)

{
  size_t *psVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar2;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar3;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar4;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *temp_node;
  
  this->_vptr_PriorityQueue = (_func_int **)&PTR__PriorityQueue_0010cc38;
  (this->_list)._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cc68;
  pLVar3 = (this->_list)._tail;
  pLVar4 = (this->_list)._header;
  while (pLVar4 != pLVar3) {
    pLVar2 = pLVar4->_next;
    if (pLVar2 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
      pLVar4->_next = pLVar2->_next;
      (*pLVar2->_vptr_ListNode[1])(pLVar2);
      pLVar3 = (this->_list)._tail;
    }
    if (pLVar2 == pLVar3) {
      (this->_list)._tail = pLVar4;
      pLVar3 = pLVar4;
    }
    psVar1 = &(this->_list)._size;
    *psVar1 = *psVar1 - 1;
    pLVar4 = (this->_list)._header;
  }
  if (pLVar4 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
    (*pLVar4->_vptr_ListNode[1])(pLVar4);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

inline
    PriorityQueue<T>::~PriorityQueue() {}